

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

void __thiscall dap::ProgressStartEvent::ProgressStartEvent(ProgressStartEvent *this)

{
  (this->cancellable).val = false;
  (this->cancellable).set = false;
  (this->message).val._M_dataplus._M_p = (pointer)&(this->message).val.field_2;
  (this->message).val._M_string_length = 0;
  (this->message).val.field_2._M_local_buf[0] = '\0';
  (this->message).set = false;
  (this->percentage).val.val = 0.0;
  (this->percentage).set = false;
  (this->progressId)._M_dataplus._M_p = (pointer)&(this->progressId).field_2;
  (this->progressId)._M_string_length = 0;
  (this->progressId).field_2._M_local_buf[0] = '\0';
  (this->requestId).val.val = 0;
  (this->requestId).set = false;
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  (this->title)._M_string_length = 0;
  (this->title).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

inline boolean() : val(false) {}